

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UBool ures_cleanup(void)

{
  if (cache != (UHashtable *)0x0) {
    ures_flushCache();
    uhash_close_63(cache);
    cache = (UHashtable *)0x0;
  }
  icu_63::UInitOnce::reset(&gCacheInitOnce);
  return '\x01';
}

Assistant:

static UBool U_CALLCONV ures_cleanup(void)
{
    if (cache != NULL) {
        ures_flushCache();
        uhash_close(cache);
        cache = NULL;
    }
    gCacheInitOnce.reset();
    return TRUE;
}